

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_2::StencilOpSeparateTestCase::SetStencilOp
          (StencilOpSeparateTestCase *this,GLenum stencilOpValue)

{
  GLenum dpfail;
  GLenum sfail;
  GLenum GVar1;
  
  GVar1 = (this->super_StencilOpTestCase).m_stencilOpName;
  if ((int)GVar1 < 0x8801) {
    if (GVar1 == 0xb94) {
LAB_0060d084:
      GVar1 = *(GLenum *)&(this->super_StencilOpTestCase).field_0xa4;
      dpfail = 0x1e00;
      sfail = stencilOpValue;
      goto LAB_0060d0c3;
    }
    if (GVar1 != 0xb95) {
      if (GVar1 != 0xb96) {
        return;
      }
      goto LAB_0060d098;
    }
  }
  else {
    if (GVar1 == 0x8803) {
LAB_0060d098:
      glu::CallLogWrapper::glStencilOpSeparate
                (&(this->super_StencilOpTestCase).super_ApiCase.super_CallLogWrapper,
                 *(GLenum *)&(this->super_StencilOpTestCase).field_0xa4,0x1e00,0x1e00,stencilOpValue
                );
      return;
    }
    if (GVar1 != 0x8802) {
      if (GVar1 != 0x8801) {
        return;
      }
      goto LAB_0060d084;
    }
  }
  GVar1 = *(GLenum *)&(this->super_StencilOpTestCase).field_0xa4;
  sfail = 0x1e00;
  dpfail = stencilOpValue;
LAB_0060d0c3:
  glu::CallLogWrapper::glStencilOpSeparate
            (&(this->super_StencilOpTestCase).super_ApiCase.super_CallLogWrapper,GVar1,sfail,dpfail,
             0x1e00);
  return;
}

Assistant:

void SetStencilOp (GLenum stencilOpValue)
	{
		switch (m_stencilOpName)
		{
		case GL_STENCIL_FAIL:
		case GL_STENCIL_BACK_FAIL:
			glStencilOpSeparate(m_stencilOpFace, stencilOpValue, GL_KEEP, GL_KEEP);
			break;

		case GL_STENCIL_PASS_DEPTH_FAIL:
		case GL_STENCIL_BACK_PASS_DEPTH_FAIL:
			glStencilOpSeparate(m_stencilOpFace, GL_KEEP, stencilOpValue, GL_KEEP);
			break;

		case GL_STENCIL_PASS_DEPTH_PASS:
		case GL_STENCIL_BACK_PASS_DEPTH_PASS:
			glStencilOpSeparate(m_stencilOpFace, GL_KEEP, GL_KEEP, stencilOpValue);
			break;

		default:
			DE_ASSERT(false && "should not happen");
			break;
		}
	}